

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

cmStateSnapshot * __thiscall
cmState::CreateMacroCallSnapshot
          (cmStateSnapshot *__return_storage_ptr__,cmState *this,cmStateSnapshot *originSnapshot,
          string *fileName)

{
  PositionType *this_00;
  iterator it;
  PositionType PVar1;
  bool bVar2;
  ReferenceType pSVar3;
  PointerType pSVar4;
  PointerType pBVar5;
  PointerType pSVar6;
  long lVar7;
  undefined8 *puVar8;
  byte bVar9;
  iterator iVar10;
  SnapshotDataType in_stack_fffffffffffffec8;
  PositionType pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar9 = 0;
  this_00 = &originSnapshot->Position;
  it.Tree = (originSnapshot->Position).Tree;
  it.Position = (originSnapshot->Position).Position;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator*(this_00);
  puVar8 = (undefined8 *)&stack0xfffffffffffffec8;
  for (lVar7 = 0x18; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar8 = (pSVar3->ScopeParent).Tree;
    pSVar3 = (ReferenceType)((long)pSVar3 + (ulong)bVar9 * -0x10 + 8);
    puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
  }
  pos = cmLinkedTree<cmStateDetail::SnapshotDataType>::Push_impl
                  (&this->SnapshotData,it,in_stack_fffffffffffffec8);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
  pSVar4->SnapshotType = MacroCallType;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
  pSVar4->Keep = false;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  iVar10 = pSVar4->ExecutionListFile;
  std::__cxx11::string::string((string *)&local_50,(string *)fileName);
  iVar10 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Push(&this->ExecutionListFiles,iVar10,&local_50);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
  pSVar4->ExecutionListFile = iVar10;
  std::__cxx11::string::~string((string *)&local_50);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  bVar2 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar4->Vars);
  if (bVar2) {
    pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
    pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar4->BuildSystemDirectory);
    (pBVar5->DirectoryEnd).Tree = pos.Tree;
    (pBVar5->DirectoryEnd).Position = pos.Position;
    pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
    PVar1 = (pSVar4->Policies).Position;
    (pSVar6->PolicyScope).Tree = (pSVar4->Policies).Tree;
    (pSVar6->PolicyScope).Position = PVar1;
    cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,pos);
    return __return_storage_ptr__;
  }
  __assert_fail("originSnapshot.Position->Vars.IsValid()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmState.cxx"
                ,0x2b9,
                "cmStateSnapshot cmState::CreateMacroCallSnapshot(const cmStateSnapshot &, const std::string &)"
               );
}

Assistant:

cmStateSnapshot cmState::CreateMacroCallSnapshot(
  cmStateSnapshot const& originSnapshot, std::string const& fileName)
{
  cmStateDetail::PositionType pos =
    this->SnapshotData.Push(originSnapshot.Position, *originSnapshot.Position);
  pos->SnapshotType = cmStateEnums::MacroCallType;
  pos->Keep = false;
  pos->ExecutionListFile = this->ExecutionListFiles.Push(
    originSnapshot.Position->ExecutionListFile, fileName);
  assert(originSnapshot.Position->Vars.IsValid());
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  return cmStateSnapshot(this, pos);
}